

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall Js::InterpreterStackFrame::RestoreSp(InterpreterStackFrame *this)

{
  ulong *puVar1;
  ulong *puVar2;
  code *pcVar3;
  bool bVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  
  if (*(ulong *)(this + 0x38) == 0) {
    RVar5 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    *(InterpreterStackFrame **)(this + 0x28) = this + (ulong)RVar5 * 8 + 0x160;
    *(InterpreterStackFrame **)(this + 0x30) = this + (ulong)RVar5 * 8 + 0x160;
    *(undefined8 *)(this + 0x38) = 0;
  }
  else {
    if (*(ulong *)(this + 0x30) <= *(ulong *)(this + 0x38)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x991,"(m_outSpCached < m_outSp)","m_outSpCached < m_outSp");
      if (!bVar4) goto LAB_00a78b4e;
      *puVar6 = 0;
    }
    puVar1 = *(ulong **)(this + 0x38);
    *(ulong **)(this + 0x30) = puVar1;
    puVar2 = (ulong *)*puVar1;
    *(ulong **)(this + 0x38) = puVar2;
    if (puVar1 < puVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x995,"(m_outSpCached == nullptr || m_outSpCached <= m_outSp)",
                                  "m_outSpCached == nullptr || m_outSpCached <= m_outSp");
      if (!bVar4) {
LAB_00a78b4e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    *(undefined8 *)(this + 0x28) = *(undefined8 *)(*(long *)(this + 0x30) + 8);
  }
  return;
}

Assistant:

inline void InterpreterStackFrame::RestoreSp()
    {
        // This will be called in the Finally block to restore from the previous SP cached.

        // m_outSpCached can be null if the catch block is called.
        if (m_outSpCached != nullptr)
        {
            Assert(m_outSpCached < m_outSp);
            m_outSp = m_outSpCached;

            m_outSpCached = (Var*)*m_outSp;
            Assert(m_outSpCached == nullptr || m_outSpCached <= m_outSp);

            m_outParams = (Var*)*(m_outSp + 1);
        }
        else
        {
            ResetOut();
        }
    }